

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::StringTrieBuilder::ListBranchNode::markRightEdgesFirst
          (ListBranchNode *this,int32_t edgeNumber)

{
  Node *pNVar1;
  Node *edge;
  int local_18;
  int32_t i;
  int32_t step;
  int32_t edgeNumber_local;
  ListBranchNode *this_local;
  
  i = edgeNumber;
  if ((this->super_BranchNode).super_Node.offset == 0) {
    (this->super_BranchNode).firstEdgeNumber = edgeNumber;
    local_18 = 0;
    edge._4_4_ = this->length;
    do {
      edge._4_4_ = edge._4_4_ + -1;
      pNVar1 = this->equal[edge._4_4_];
      if (pNVar1 != (Node *)0x0) {
        i = (*(pNVar1->super_UObject)._vptr_UObject[4])(pNVar1,(ulong)(uint)(i - local_18));
      }
      local_18 = 1;
    } while (0 < edge._4_4_);
    (this->super_BranchNode).super_Node.offset = i;
  }
  return i;
}

Assistant:

int32_t
StringTrieBuilder::ListBranchNode::markRightEdgesFirst(int32_t edgeNumber) {
    if(offset==0) {
        firstEdgeNumber=edgeNumber;
        int32_t step=0;
        int32_t i=length;
        do {
            Node *edge=equal[--i];
            if(edge!=NULL) {
                edgeNumber=edge->markRightEdgesFirst(edgeNumber-step);
            }
            // For all but the rightmost edge, decrement the edge number.
            step=1;
        } while(i>0);
        offset=edgeNumber;
    }
    return edgeNumber;
}